

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
             *this,wchar_t **it)

{
  wchar_t *pwVar1;
  
  pwVar1 = *it;
  if (*(long *)(this + 0x10) != 0) {
    pwVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>
                       (*(char **)(this + 8),*(char **)(this + 8) + *(long *)(this + 0x10),pwVar1);
    *it = pwVar1;
  }
  pwVar1 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>
                     (pwVar1,*(undefined8 *)(this + 0x20),this + 0x18);
  *it = pwVar1;
  int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
            ((dec_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }